

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

Keyword * __thiscall
Map::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
::operator[](Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *pPVar1;
  Iterator IVar2;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  local_50;
  Iterator local_28;
  
  std::__cxx11::string::string((string *)&local_50,(string *)key);
  local_50.value = ZERO;
  IVar2 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
          ::search(&this->tree,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (IVar2.node_ptr ==
      (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
       *)0x0) {
    std::__cxx11::string::string((string *)&local_50,(string *)key);
    local_50.value = ZERO;
    BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
    ::insert(&this->tree,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_50,(string *)key);
  local_50.value = ZERO;
  local_28 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
             ::search(&this->tree,&local_50);
  pPVar1 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
           ::Iterator::operator->(&local_28);
  std::__cxx11::string::~string((string *)&local_50);
  return &pPVar1->value;
}

Assistant:

T& Map<Key, T>::operator[](const Key& key) {
    if (tree.search(Pair<Key, T>(key, T())) == nullptr)
        tree.insert(Pair<Key, T>(key, T()));
    return tree.search(Pair<Key, T>(key, T()))->value;
}